

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void pystringtest_pystring_startswith(void)

{
  byte bVar1;
  ostream *poVar2;
  allocator<char> local_5b1;
  string local_5b0 [37];
  byte local_58b;
  byte local_58a;
  allocator<char> local_589;
  string local_588 [39];
  allocator<char> local_561;
  string local_560 [39];
  allocator<char> local_539;
  string local_538 [37];
  byte local_513;
  byte local_512;
  allocator<char> local_511;
  string local_510 [37];
  byte local_4eb;
  byte local_4ea;
  allocator<char> local_4e9;
  string local_4e8 [39];
  allocator<char> local_4c1;
  string local_4c0 [39];
  allocator<char> local_499;
  string local_498 [37];
  byte local_473;
  byte local_472;
  allocator<char> local_471;
  string local_470 [37];
  byte local_44b;
  byte local_44a;
  allocator<char> local_449;
  string local_448 [39];
  allocator<char> local_421;
  string local_420 [39];
  allocator<char> local_3f9;
  string local_3f8 [37];
  byte local_3d3;
  byte local_3d2;
  allocator<char> local_3d1;
  string local_3d0 [37];
  byte local_3ab;
  byte local_3aa;
  allocator<char> local_3a9;
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [39];
  allocator<char> local_359;
  string local_358 [37];
  byte local_333;
  byte local_332;
  allocator<char> local_331;
  string local_330 [37];
  byte local_30b;
  byte local_30a;
  allocator<char> local_309;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [37];
  byte local_293;
  byte local_292;
  allocator<char> local_291;
  string local_290 [37];
  byte local_26b;
  byte local_26a;
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [37];
  byte local_1f3;
  byte local_1f2;
  allocator<char> local_1f1;
  string local_1f0 [37];
  byte local_1cb;
  byte local_1ca;
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [37];
  byte local_153;
  byte local_152;
  allocator<char> local_151;
  string local_150 [37];
  byte local_12b;
  byte local_12a;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [37];
  byte local_b3;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0 [37];
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  local_8a = 0;
  local_8b = 0;
  local_b2 = 0;
  local_b3 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_28,"",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"",&local_61);
  bVar1 = pystring::startswith(local_28,local_60,0,0x7fffffff);
  if ((bVar1 & 1) != 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ea);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"\", \"\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_8a = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_89);
    local_8b = 1;
    std::allocator<char>::allocator();
    local_b2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"",&local_b1);
    local_b3 = 1;
    bVar1 = pystring::startswith(local_88,local_b0,0,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_b3 & 1) != 0) {
    std::__cxx11::string::~string(local_b0);
  }
  if ((local_b2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_b1);
  }
  if ((local_8b & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  if ((local_8a & 1) != 0) {
    std::allocator<char>::~allocator(&local_89);
  }
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  local_12a = 0;
  local_12b = 0;
  local_152 = 0;
  local_153 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"a",&local_101);
  bVar1 = pystring::startswith(local_d8,local_100,0,0x7fffffff);
  if ((bVar1 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1eb);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"\", \"a\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"false");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_12a = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_128,"",&local_129);
    local_12b = 1;
    std::allocator<char>::allocator();
    local_152 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_150,"a",&local_151);
    local_153 = 1;
    bVar1 = pystring::startswith(local_128,local_150,0,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,false);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_153 & 1) != 0) {
    std::__cxx11::string::~string(local_150);
  }
  if ((local_152 & 1) != 0) {
    std::allocator<char>::~allocator(&local_151);
  }
  if ((local_12b & 1) != 0) {
    std::__cxx11::string::~string(local_128);
  }
  if ((local_12a & 1) != 0) {
    std::allocator<char>::~allocator(&local_129);
  }
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  local_1ca = 0;
  local_1cb = 0;
  local_1f2 = 0;
  local_1f3 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_178,"a",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"",&local_1a1);
  bVar1 = pystring::startswith(local_178,local_1a0,0,0x7fffffff);
  if ((bVar1 & 1) != 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ec);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"a\", \"\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_1ca = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_1c8,"a",&local_1c9);
    local_1cb = 1;
    std::allocator<char>::allocator();
    local_1f2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_1f0,"",&local_1f1);
    local_1f3 = 1;
    bVar1 = pystring::startswith(local_1c8,local_1f0,0,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_1f3 & 1) != 0) {
    std::__cxx11::string::~string(local_1f0);
  }
  if ((local_1f2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1f1);
  }
  if ((local_1cb & 1) != 0) {
    std::__cxx11::string::~string(local_1c8);
  }
  if ((local_1ca & 1) != 0) {
    std::allocator<char>::~allocator(&local_1c9);
  }
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  local_26a = 0;
  local_26b = 0;
  local_292 = 0;
  local_293 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_218,"abc",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_240,"ab",&local_241);
  bVar1 = pystring::startswith(local_218,local_240,0,0x7fffffff);
  if ((bVar1 & 1) != 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ed);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abc\", \"ab\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_26a = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_268,"abc",&local_269);
    local_26b = 1;
    std::allocator<char>::allocator();
    local_292 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_290,"ab",&local_291);
    local_293 = 1;
    bVar1 = pystring::startswith(local_268,local_290,0,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_293 & 1) != 0) {
    std::__cxx11::string::~string(local_290);
  }
  if ((local_292 & 1) != 0) {
    std::allocator<char>::~allocator(&local_291);
  }
  if ((local_26b & 1) != 0) {
    std::__cxx11::string::~string(local_268);
  }
  if ((local_26a & 1) != 0) {
    std::allocator<char>::~allocator(&local_269);
  }
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  local_30a = 0;
  local_30b = 0;
  local_332 = 0;
  local_333 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"abc",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"abc",&local_2e1);
  bVar1 = pystring::startswith(local_2b8,local_2e0,0,0x7fffffff);
  if ((bVar1 & 1) != 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ee);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abc\", \"abc\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_30a = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_308,"abc",&local_309);
    local_30b = 1;
    std::allocator<char>::allocator();
    local_332 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_330,"abc",&local_331);
    local_333 = 1;
    bVar1 = pystring::startswith(local_308,local_330,0,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_333 & 1) != 0) {
    std::__cxx11::string::~string(local_330);
  }
  if ((local_332 & 1) != 0) {
    std::allocator<char>::~allocator(&local_331);
  }
  if ((local_30b & 1) != 0) {
    std::__cxx11::string::~string(local_308);
  }
  if ((local_30a & 1) != 0) {
    std::allocator<char>::~allocator(&local_309);
  }
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  local_3aa = 0;
  local_3ab = 0;
  local_3d2 = 0;
  local_3d3 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_358,"abc",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_380,"abcd",&local_381);
  bVar1 = pystring::startswith(local_358,local_380,0,0x7fffffff);
  if ((bVar1 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ef);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abc\", \"abcd\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"false");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_3aa = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_3a8,"abc",&local_3a9);
    local_3ab = 1;
    std::allocator<char>::allocator();
    local_3d2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_3d0,"abcd",&local_3d1);
    local_3d3 = 1;
    bVar1 = pystring::startswith(local_3a8,local_3d0,0,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,false);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_3d3 & 1) != 0) {
    std::__cxx11::string::~string(local_3d0);
  }
  if ((local_3d2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_3d1);
  }
  if ((local_3ab & 1) != 0) {
    std::__cxx11::string::~string(local_3a8);
  }
  if ((local_3aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_3a9);
  }
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator(&local_381);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  std::allocator<char>::allocator();
  local_44a = 0;
  local_44b = 0;
  local_472 = 0;
  local_473 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"abcdef",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_420,"abc",&local_421);
  bVar1 = pystring::startswith(local_3f8,local_420,0,0x7fffffff);
  if ((bVar1 & 1) != 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f0);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abcdef\", \"abc\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_44a = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_448,"abcdef",&local_449);
    local_44b = 1;
    std::allocator<char>::allocator();
    local_472 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_470,"abc",&local_471);
    local_473 = 1;
    bVar1 = pystring::startswith(local_448,local_470,0,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_473 & 1) != 0) {
    std::__cxx11::string::~string(local_470);
  }
  if ((local_472 & 1) != 0) {
    std::allocator<char>::~allocator(&local_471);
  }
  if ((local_44b & 1) != 0) {
    std::__cxx11::string::~string(local_448);
  }
  if ((local_44a & 1) != 0) {
    std::allocator<char>::~allocator(&local_449);
  }
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator(&local_421);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::allocator<char>::allocator();
  local_4ea = 0;
  local_4eb = 0;
  local_512 = 0;
  local_513 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_498,"abcdef",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"abc",&local_4c1);
  bVar1 = pystring::startswith(local_498,local_4c0,1,0x7fffffff);
  if ((bVar1 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f1);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abcdef\", \"abc\", 1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"false");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_4ea = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_4e8,"abcdef",&local_4e9);
    local_4eb = 1;
    std::allocator<char>::allocator();
    local_512 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_510,"abc",&local_511);
    local_513 = 1;
    bVar1 = pystring::startswith(local_4e8,local_510,1,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,false);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_513 & 1) != 0) {
    std::__cxx11::string::~string(local_510);
  }
  if ((local_512 & 1) != 0) {
    std::allocator<char>::~allocator(&local_511);
  }
  if ((local_4eb & 1) != 0) {
    std::__cxx11::string::~string(local_4e8);
  }
  if ((local_4ea & 1) != 0) {
    std::allocator<char>::~allocator(&local_4e9);
  }
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  local_58a = 0;
  local_58b = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_538,"abcdef",&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_560,"bc",&local_561);
  bVar1 = pystring::startswith(local_538,local_560,1,0x7fffffff);
  if ((bVar1 & 1) != 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f2);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abcdef\", \"bc\", 1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_58a = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_588,"abcdef",&local_589);
    local_58b = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_5b0,"bc",&local_5b1);
    bVar1 = pystring::startswith(local_588,local_5b0,1,0x7fffffff);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(bVar1 & 1));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
  }
  if ((local_58b & 1) != 0) {
    std::__cxx11::string::~string(local_588);
  }
  if ((local_58a & 1) != 0) {
    std::allocator<char>::~allocator(&local_589);
  }
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator(&local_561);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator(&local_539);
  return;
}

Assistant:

PYSTRING_ADD_TEST(pystring, startswith)
{
    PYSTRING_CHECK_EQUAL(pystring::startswith("", ""), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("", "a"), false);
    PYSTRING_CHECK_EQUAL(pystring::startswith("a", ""), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abc", "ab"), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abc", "abc"), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abc", "abcd"), false);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abcdef", "abc"), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abcdef", "abc", 1), false);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abcdef", "bc", 1), true);
}